

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

bool __thiscall LTFlightData::TryDeriveGrndStatus(LTFlightData *this,positionTy *pos)

{
  bool bVar1;
  posFlagsTy pVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  unique_lock<std::recursive_mutex> lock;
  LTChannel *pChn;
  unique_lock<std::recursive_mutex> local_48;
  double local_38;
  double local_30;
  LTChannel *local_28;
  
  local_48._M_device = &this->dataAccessMutex;
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)local_48._M_device);
  local_48._M_owns = iVar3 == 0;
  if (local_48._M_owns) {
    dVar5 = ::YProbe_at_m(pos,&this->probeRef);
    bVar4 = !NAN(dVar5);
    if (!NAN(dVar5)) {
      pVar2 = pos->f;
      if (((ushort)pVar2 & 0x300) != 0x200) {
        local_38 = pos->_alt;
        local_28 = (LTChannel *)0x0;
        local_30 = dVar5;
        bVar1 = GetCurrChannel(this,&local_28);
        if ((bVar1 && local_28 != (LTChannel *)0x0) &&
           (local_28->channel == DR_CHANNEL_REAL_TRAFFIC_ONLINE)) {
          dVar6 = 20.0;
        }
        else {
          dVar6 = 10.0;
        }
        pVar2 = pos->f;
        dVar5 = local_30;
        if (local_38 < dVar6 + local_30) {
          pVar2 = (posFlagsTy)((ushort)pVar2 & 0xfcff | 0x200);
          pos->f = pVar2;
        }
      }
      if (((ushort)pVar2 & 0x300) == 0x200) {
        pos->_alt = dVar5 + -0.5;
      }
      else {
        pos->f = (posFlagsTy)((ushort)pVar2 & 0xfcff | 0x100);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  }
  else {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool LTFlightData::TryDeriveGrndStatus (positionTy& pos)
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock );
        if ( lock )
        {
            // what's the terrain altitude at that pos?
            double terrainAlt = YProbe_at_m(pos);
            if (std::isnan(terrainAlt))
                return false;
            
            // Now 2 options:
            // If position already says itself: I'm on the ground, then keep it like that
            // Otherwise decide based on altitude _if_ it's on the ground
            if (!pos.IsOnGnd() &&
                // say it's on the ground if below terrain+10m (or 20m in case of RealTraffic)
                pos.alt_m() < terrainAlt + (GetCurrChannel() == DR_CHANNEL_REAL_TRAFFIC_ONLINE ? FD_GND_AGL_EXT : FD_GND_AGL))
                pos.f.onGrnd = GND_ON;

            // if it was or now is on the ground correct the altitue to terrain altitude
            // (very slightly below to be sure to actually touch down even after rounding effects)
            if (pos.IsOnGnd())
                pos.alt_m() = terrainAlt - MDL_CLOSE_TO_GND;
            else
                // make sure it's either GND_ON or GND_OFF, nothing lese
                pos.f.onGrnd = GND_OFF;

            // successfully determined a status
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}